

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

string * __thiscall
deqp::sl::ShaderCase::genFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,ValueBlock *valueBlock)

{
  bool bVar1;
  DataType DVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference pvVar6;
  char *pcVar7;
  char *pcVar8;
  char *refTypeStr;
  char *floatTypeStr;
  DataType floatType;
  Value *val;
  int ndx;
  char *fragIn;
  bool customColorOut;
  undefined1 local_198 [7];
  bool usesInout;
  ostringstream shader;
  ValueBlock *valueBlock_local;
  ShaderCase *this_local;
  
  shader._368_8_ = valueBlock;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  bVar1 = usesShaderInoutQualifiers(this->m_targetVersion);
  pcVar8 = "varying";
  if (bVar1) {
    pcVar8 = "in";
  }
  pcVar3 = glu::getGLSLVersionDeclaration(this->m_targetVersion);
  poVar4 = std::operator<<((ostream *)local_198,pcVar3);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)local_198,"precision mediump float;\n");
  std::operator<<((ostream *)local_198,"precision mediump int;\n");
  std::operator<<((ostream *)local_198,"\n");
  if (bVar1) {
    std::operator<<((ostream *)local_198,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
    std::operator<<((ostream *)local_198,"\n");
  }
  genCompareFunctions((ostringstream *)local_198,(ValueBlock *)shader._368_8_,true);
  std::operator<<((ostream *)local_198,"\n");
  val._4_4_ = 0;
  while( true ) {
    sVar5 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>::
            size((vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                  *)(shader._368_8_ + 8));
    if ((int)sVar5 <= val._4_4_) break;
    pvVar6 = std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ::operator[]((vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                           *)(shader._368_8_ + 8),(long)val._4_4_);
    DVar2 = glu::getDataTypeFloatScalars(pvVar6->dataType);
    pcVar3 = glu::getDataTypeName(DVar2);
    pcVar7 = glu::getDataTypeName(pvVar6->dataType);
    if (pvVar6->storageType == STORAGE_OUTPUT) {
      DVar2 = glu::getDataTypeScalarType(pvVar6->dataType);
      if (DVar2 == TYPE_FLOAT) {
        poVar4 = std::operator<<((ostream *)local_198,pcVar8);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,pcVar3);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
        std::operator<<(poVar4,";\n");
      }
      else {
        poVar4 = std::operator<<((ostream *)local_198,pcVar8);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,pcVar3);
        poVar4 = std::operator<<(poVar4," v_");
        poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
        std::operator<<(poVar4,";\n");
      }
      poVar4 = std::operator<<((ostream *)local_198,"uniform ");
      poVar4 = std::operator<<(poVar4,pcVar7);
      poVar4 = std::operator<<(poVar4," ref_");
      poVar4 = std::operator<<(poVar4,(string *)&pvVar6->valueName);
      std::operator<<(poVar4,";\n");
    }
    val._4_4_ = val._4_4_ + 1;
  }
  std::operator<<((ostream *)local_198,"\n");
  std::operator<<((ostream *)local_198,"void main()\n");
  std::operator<<((ostream *)local_198,"{\n");
  std::operator<<((ostream *)local_198," ");
  pcVar8 = "gl_FragColor";
  if (bVar1) {
    pcVar8 = "dEQP_FragColor";
  }
  genCompareOp((ostringstream *)local_198,pcVar8,(ValueBlock *)shader._368_8_,"v_",(char *)0x0);
  std::operator<<((ostream *)local_198,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

string ShaderCase::genFragmentShader(const ValueBlock& valueBlock)
{
	ostringstream shader;
	const bool	usesInout		 = usesShaderInoutQualifiers(m_targetVersion);
	const bool	customColorOut = usesInout;
	const char*   fragIn		 = usesInout ? "in" : "varying";

	shader << glu::getGLSLVersionDeclaration(m_targetVersion) << "\n";

	shader << "precision mediump float;\n";
	shader << "precision mediump int;\n";
	shader << "\n";

	if (customColorOut)
	{
		shader << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
		shader << "\n";
	}

	genCompareFunctions(shader, valueBlock, true);
	shader << "\n";

	// Declarations (varying, reference for each output).
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val		  = valueBlock.values[ndx];
		DataType				 floatType	= getDataTypeFloatScalars(val.dataType);
		const char*				 floatTypeStr = getDataTypeName(floatType);
		const char*				 refTypeStr   = getDataTypeName(val.dataType);

		if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				shader << fragIn << " " << floatTypeStr << " " << val.valueName << ";\n";
			else
				shader << fragIn << " " << floatTypeStr << " v_" << val.valueName << ";\n";

			shader << "uniform " << refTypeStr << " ref_" << val.valueName << ";\n";
		}
	}

	shader << "\n";
	shader << "void main()\n";
	shader << "{\n";

	shader << " ";
	genCompareOp(shader, customColorOut ? "dEQP_FragColor" : "gl_FragColor", valueBlock, "v_", DE_NULL);

	shader << "}\n";
	return shader.str();
}